

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O3

void deqp::egl::initSurface(Functions *gl,IVec2 *oldSize)

{
  Vector<int,_2> res_1;
  Vector<int,_2> res;
  IVec2 local_e0;
  IVec2 local_d8;
  IVec2 local_d0;
  IVec2 local_c8;
  IVec2 local_c0;
  IVec2 local_b8;
  IVec2 local_b0;
  IVec2 local_a8;
  IVec2 local_a0;
  IVec2 local_98;
  IVec2 local_90;
  IVec2 local_88;
  Vec3 local_80;
  Vec3 local_70;
  Vec3 local_60;
  Vec3 local_50;
  Vec3 local_40;
  Vec3 local_30;
  
  local_88.m_data[0] = 0;
  local_88.m_data[1] = 0;
  local_d0 = *(IVec2 *)oldSize->m_data;
  local_30.m_data[0] = 0.0;
  local_30.m_data[1] = 0.0;
  local_30.m_data[2] = 1.0;
  drawRectangle(gl,&local_88,&local_d0,&local_30);
  local_90.m_data[0] = 2;
  local_90.m_data[1] = 2;
  local_d8.m_data[0] = (int)*(undefined8 *)oldSize->m_data + -4;
  local_d8.m_data[1] = (int)((ulong)*(undefined8 *)oldSize->m_data >> 0x20) + -4;
  local_40.m_data[0] = 1.0;
  local_40.m_data[1] = 0.0;
  local_40.m_data[2] = 0.0;
  drawRectangle(gl,&local_90,&local_d8,&local_40);
  local_98.m_data[0] = 0;
  local_98.m_data[1] = 0;
  local_a0.m_data[0] = 8;
  local_a0.m_data[1] = 4;
  local_50.m_data[0] = 0.0;
  local_50.m_data[1] = 1.0;
  local_50.m_data[2] = 0.0;
  drawRectangle(gl,&local_98,&local_a0,&local_50);
  local_e0.m_data[0] = (int)*(undefined8 *)oldSize->m_data + -0x10;
  local_e0.m_data[1] = (int)((ulong)*(undefined8 *)oldSize->m_data >> 0x20) + -0x10;
  local_a8.m_data[0] = 8;
  local_a8.m_data[1] = 4;
  local_60.m_data[0] = 0.0;
  local_60.m_data[1] = 1.0;
  local_60.m_data[2] = 0.0;
  drawRectangle(gl,&local_e0,&local_a8,&local_60);
  local_b0.m_data[1] = oldSize->m_data[1] + -0x10;
  local_b0.m_data[0] = 0;
  local_b8.m_data[0] = 8;
  local_b8.m_data[1] = 4;
  local_70.m_data[0] = 0.0;
  local_70.m_data[1] = 1.0;
  local_70.m_data[2] = 0.0;
  drawRectangle(gl,&local_b0,&local_b8,&local_70);
  local_c0.m_data[0] = oldSize->m_data[0] + -0x10;
  local_c0.m_data[1] = 0;
  local_c8.m_data[0] = 8;
  local_c8.m_data[1] = 4;
  local_80.m_data[0] = 0.0;
  local_80.m_data[1] = 1.0;
  local_80.m_data[2] = 0.0;
  drawRectangle(gl,&local_c0,&local_c8,&local_80);
  return;
}

Assistant:

void initSurface (const glw::Functions& gl, IVec2 oldSize)
{
	const Vec3	frameColor	(0.0f, 0.0f, 1.0f);
	const Vec3	fillColor	(1.0f, 0.0f, 0.0f);
	const Vec3	markColor	(0.0f, 1.0f, 0.0f);

	drawRectangle(gl, IVec2(0, 0), oldSize, frameColor);
	drawRectangle(gl, IVec2(2, 2), oldSize - IVec2(4, 4), fillColor);

	drawRectangle(gl, IVec2(0, 0), IVec2(8, 4), markColor);
	drawRectangle(gl, oldSize - IVec2(16, 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(0, oldSize.y() - 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(oldSize.x() - 16, 0), IVec2(8, 4), markColor);
}